

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::NavierStokesBase
          (NavierStokesBase *this,Amr *papa,int lev,Geometry *level_geom,BoxArray *bl,
          DistributionMapping *dm,Real time)

{
  bool bVar1;
  double *pdVar2;
  StateData *this_00;
  DistributionMapping *dm_00;
  void *pvVar3;
  Projection *pPVar4;
  void *pvVar5;
  PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *a_vector;
  MacProj *pMVar6;
  CoordSys *in_RCX;
  undefined8 *in_RDI;
  BoxArray *P_grids;
  int n;
  NavierStokesBase *in_stack_00000548;
  size_type in_stack_fffffffffffffad8;
  int lev_00;
  NavierStokesBase *in_stack_fffffffffffffae0;
  Geometry *in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaf0;
  int in_stack_fffffffffffffaf4;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *in_stack_fffffffffffffaf8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *v;
  MFInfo *in_stack_fffffffffffffb00;
  BoxArray *in_stack_fffffffffffffb08;
  FluxRegister *in_stack_fffffffffffffb10;
  BoxArray *in_stack_fffffffffffffb18;
  MultiFab *in_stack_fffffffffffffb20;
  BoxArray *in_stack_fffffffffffffb28;
  MultiFab *in_stack_fffffffffffffb30;
  FabFactory<amrex::FArrayBox> *factory;
  FabFactory<amrex::FArrayBox> *in_stack_fffffffffffffb40;
  StateData *in_stack_fffffffffffffb60;
  NavierStokesBase *pNVar7;
  FluxRegister *Viscflux_reg;
  int iVar8;
  Diffusion *Coarser;
  Amr *Parent;
  Diffusion *this_01;
  Vector<int,_std::allocator<int>_> *_is_diffusive;
  IntVect *ref_ratio;
  int iVar9;
  DistributionMapping *dmap;
  BoxArray *fine_boxes;
  SyncRegister *this_02;
  AmrLevel *level_data;
  int _finest_level;
  Amr *_parent;
  AmrLevel *level_data_00;
  undefined8 *puVar10;
  int level;
  MacProj *this_03;
  undefined8 *local_2a8;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> local_270;
  NavierStokesBase *in_stack_fffffffffffffda8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1a9;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  Real in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  BoxArray *in_stack_fffffffffffffe88;
  Geometry *in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  Amr *in_stack_fffffffffffffea0;
  AmrLevel *in_stack_fffffffffffffea8;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  Diffusion local_118;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  BoxArray *local_60;
  int local_58;
  CoordSys *local_30;
  char *local_10;
  char *local_8;
  
  local_30 = in_RCX;
  amrex::AmrLevel::AmrLevel
            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
             (int)((ulong)in_stack_fffffffffffffe98 >> 0x20),in_stack_fffffffffffffe90,
             in_stack_fffffffffffffe88,
             (DistributionMapping *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78);
  *in_RDI = &PTR__NavierStokesBase_018020b0;
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  local_2a8 = in_RDI + 0xa8;
  do {
    amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
    local_2a8 = local_2a8 + 0x30;
  } while (local_2a8 != in_RDI + 0x138);
  fine_boxes = (BoxArray *)(in_RDI + 0x13a);
  amrex::FabArray<amrex::BaseFab<int>_>::FabArray
            ((FabArray<amrex::BaseFab<int>_> *)in_stack_fffffffffffffae0);
  this_02 = (SyncRegister *)(in_RDI + 0x173);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x5139ee);
  level_data = (AmrLevel *)(in_RDI + 0x176);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x513a0a);
  _parent = (Amr *)(in_RDI + 0x179);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::PODVector
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0);
  level_data_00 = (AmrLevel *)(in_RDI + 0x17c);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::PODVector
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0);
  puVar10 = in_RDI + 0x184;
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  this_03 = (MacProj *)(in_RDI + 0x1b4);
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  amrex::MultiFab::MultiFab((MultiFab *)in_stack_fffffffffffffae0);
  amrex::
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::Vector((Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
            *)0x513b22);
  amrex::BoxArray::BoxArray((BoxArray *)in_stack_fffffffffffffae0);
  bVar1 = amrex::CoordSys::IsRZ(local_30);
  level = (int)((ulong)puVar10 >> 0x20);
  if (bVar1) {
    local_8 = "Embedded boundaries with RZ geometry is not currently suppported.";
    amrex::Abort_host((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
    for (local_58 = 0; level = (int)((ulong)puVar10 >> 0x20), local_58 < 3; local_58 = local_58 + 1)
    {
      pdVar2 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffae0,
                          in_stack_fffffffffffffad8);
      if (0.0 < *pdVar2) {
        local_10 = 
        "RZ geometry with viscosity is not currently supported. To use set ns.vel_visc_coef=0";
        amrex::Abort_host((char *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      }
    }
  }
  if (additional_state_types_initialized == 0) {
    init_additional_state_types(in_stack_00000548);
  }
  ref_ratio = (IntVect *)(in_RDI + 0x2e);
  dmap = (DistributionMapping *)0x1;
  this_00 = amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                      ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                       in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  local_60 = amrex::StateData::boxArray(this_00);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  amrex::StateData::allocOldData(in_stack_fffffffffffffb60);
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
  amrex::StateData::allocOldData(in_stack_fffffffffffffb60);
  if (0 < *(int *)(in_RDI + 1)) {
    local_78 = 0;
    uStack_70 = 0;
    local_88 = 0;
    uStack_80 = 0;
    local_68 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x513d33);
    amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
    amrex::MultiFab::define
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
               (DistributionMapping *)in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
               (MFInfo *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40);
    amrex::MFInfo::~MFInfo((MFInfo *)0x513d86);
    local_a8 = 0;
    uStack_a0 = 0;
    local_b8 = 0;
    uStack_b0 = 0;
    local_98 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x513df2);
    amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
    amrex::MultiFab::define
              (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
               (DistributionMapping *)in_stack_fffffffffffffb20,
               (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
               (MFInfo *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40);
    amrex::MFInfo::~MFInfo((MFInfo *)0x513e44);
  }
  _is_diffusive = (Vector<int,_std::allocator<int>_> *)(in_RDI + 0x28);
  local_118.crse_ratio.vect[1] = 0;
  local_118.crse_ratio.vect[2] = 0;
  local_118.viscflux_reg = (FluxRegister *)0x0;
  local_118.finer = (Diffusion *)0x0;
  local_118.NUM_STATE = 0;
  local_118.crse_ratio.vect[0] = 0;
  local_c8 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x513f00);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
  amrex::MultiFab::define
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (DistributionMapping *)in_stack_fffffffffffffb20,
             (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
             (MFInfo *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40);
  amrex::MFInfo::~MFInfo((MFInfo *)0x513f53);
  Coarser = (Diffusion *)(in_RDI + 0x276);
  pNVar7 = (NavierStokesBase *)(in_RDI + 0x1b);
  Parent = (Amr *)(in_RDI + 0x28);
  local_118.grids = (BoxArray *)0x0;
  local_118.dmap = (DistributionMapping *)0x0;
  local_118.parent = (Amr *)0x0;
  local_118.navier_stokes = (NavierStokesBase *)0x0;
  local_118.level = 0;
  local_118._36_4_ = 0;
  this_01 = &local_118;
  amrex::MFInfo::MFInfo((MFInfo *)0x513fc1);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
  amrex::MultiFab::define
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (DistributionMapping *)in_stack_fffffffffffffb20,
             (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
             (MFInfo *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40);
  amrex::MFInfo::~MFInfo((MFInfo *)0x514014);
  Viscflux_reg = (FluxRegister *)(in_RDI + 0x28);
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_128 = 0;
  iVar8 = (int)((ulong)&local_148 >> 0x20);
  amrex::MFInfo::MFInfo((MFInfo *)0x514082);
  dm_00 = (DistributionMapping *)
          amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
  amrex::MultiFab::define
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (DistributionMapping *)in_stack_fffffffffffffb20,
             (int)((ulong)in_stack_fffffffffffffb18 >> 0x20),(int)in_stack_fffffffffffffb18,
             (MFInfo *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40);
  amrex::MFInfo::~MFInfo((MFInfo *)0x5140d5);
  in_RDI[0x274] = 0;
  in_RDI[0x275] = 0;
  buildMetrics(in_stack_fffffffffffffda8);
  init_eb((NavierStokesBase *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
          in_stack_fffffffffffffae8,(BoxArray *)in_stack_fffffffffffffae0,dm_00);
  lev_00 = (int)((ulong)dm_00 >> 0x20);
  in_RDI[0x2d6] = 0;
  if ((0 < *(int *)(in_RDI + 1)) && (do_sync_proj != 0)) {
    pvVar3 = operator_new(0x1280);
    SyncRegister::SyncRegister(this_02,fine_boxes,dmap,ref_ratio);
    in_RDI[0x2d6] = pvVar3;
  }
  iVar9 = (int)((ulong)ref_ratio >> 0x20);
  in_RDI[0x2d7] = 0;
  in_RDI[0x2d8] = 0;
  if ((0 < *(int *)(in_RDI + 1)) && (do_reflux != 0)) {
    pvVar3 = operator_new(0x988);
    amrex::FluxRegister::FluxRegister
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (DistributionMapping *)in_stack_fffffffffffffb00,(IntVect *)in_stack_fffffffffffffaf8
               ,in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
    in_RDI[0x2d7] = pvVar3;
    pvVar3 = operator_new(0x988);
    amrex::FluxRegister::FluxRegister
              (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (DistributionMapping *)in_stack_fffffffffffffb00,(IntVect *)in_stack_fffffffffffffaf8
               ,in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0);
    in_RDI[0x2d8] = pvVar3;
  }
  in_RDI[0x170] = 0;
  in_RDI[0x172] = 0;
  if (projector == (Projection *)0x0) {
    pPVar4 = (Projection *)operator_new(0x68);
    amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI[0x2a]);
    Projection::Projection
              ((Projection *)level_data,(Amr *)this_02,(BCRec *)fine_boxes,
               (int)((ulong)dmap >> 0x20),(int)dmap,iVar9);
    projector = pPVar4;
  }
  iVar9 = (int)((ulong)fine_boxes >> 0x20);
  Projection::install_level
            ((Projection *)level_data_00,(int)((ulong)_parent >> 0x20),level_data,
             (Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
              *)this_02);
  _finest_level = (int)((ulong)level_data >> 0x20);
  pvVar3 = operator_new(0x50);
  if (0 < *(int *)(in_RDI + 1)) {
    getLevel(in_stack_fffffffffffffae0,lev_00);
  }
  Diffusion::Diffusion(this_01,Parent,pNVar7,Coarser,iVar8,Viscflux_reg,_is_diffusive);
  in_RDI[0x17f] = pvVar3;
  pvVar3 = operator_new(0x180);
  amrex::MFInfo::MFInfo((MFInfo *)0x5145f7);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             (DistributionMapping *)in_stack_fffffffffffffb10,
             (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(int)in_stack_fffffffffffffb08,
             in_stack_fffffffffffffb00,(FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffb30);
  in_RDI[0x180] = pvVar3;
  amrex::MFInfo::~MFInfo((MFInfo *)0x51466d);
  pvVar3 = operator_new(0x180);
  local_1a9 = 1;
  pNVar7 = (NavierStokesBase *)(in_RDI + 0x1b);
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  amrex::MFInfo::MFInfo((MFInfo *)0x5146f5);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             (DistributionMapping *)in_stack_fffffffffffffb10,
             (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(int)in_stack_fffffffffffffb08,
             in_stack_fffffffffffffb00,(FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffb30);
  local_1a9 = 0;
  in_RDI[0x181] = pvVar3;
  amrex::MFInfo::~MFInfo((MFInfo *)0x51476b);
  pvVar3 = operator_new(0x180);
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1d8 = 0;
  uStack_1d0 = 0;
  local_1b8 = 0;
  iVar8 = (int)((ulong)&local_1d8 >> 0x20);
  amrex::MFInfo::MFInfo((MFInfo *)0x5147e0);
  amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             (DistributionMapping *)in_stack_fffffffffffffb10,
             (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(int)in_stack_fffffffffffffb08,
             in_stack_fffffffffffffb00,(FabFactory<amrex::FArrayBox> *)in_stack_fffffffffffffb30);
  in_RDI[0x182] = pvVar3;
  amrex::MFInfo::~MFInfo((MFInfo *)0x51484f);
  pvVar5 = operator_new(0x180);
  factory = (FabFactory<amrex::FArrayBox> *)(in_RDI + 0x1b);
  amrex::MFInfo::MFInfo((MFInfo *)0x5148bb);
  a_vector = (PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
             amrex::AmrLevel::Factory(&in_stack_fffffffffffffae0->super_AmrLevel);
  amrex::MultiFab::MultiFab
            (in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,
             (DistributionMapping *)in_stack_fffffffffffffb10,
             (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),(int)in_stack_fffffffffffffb08,
             in_stack_fffffffffffffb00,factory);
  in_RDI[0x183] = pvVar5;
  amrex::MFInfo::~MFInfo((MFInfo *)0x51491e);
  if (mac_projector == (MacProj *)0x0) {
    pMVar6 = (MacProj *)operator_new(0x60);
    amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI[0x2a]);
    MacProj::MacProj((MacProj *)level_data_00,_parent,_finest_level,(BCRec *)this_02,iVar9);
    mac_projector = pMVar6;
  }
  MacProj::install_level(this_03,level,level_data_00);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffb00,
             (size_type)in_stack_fffffffffffffaf8);
  fetchBCArray(pNVar7,(int)((ulong)pvVar3 >> 0x20),(int)pvVar3,iVar8);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)a_vector);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x514b6d);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (size_type)in_stack_fffffffffffffae8);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)a_vector);
  amrex::convertToDeviceVector<amrex::BCRec>(in_stack_fffffffffffffaf8);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0,
             a_vector);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~PODVector
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x514be9);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffb00,
             (size_type)in_stack_fffffffffffffaf8);
  fetchBCArray(pNVar7,(int)((ulong)pvVar3 >> 0x20),(int)pvVar3,iVar8);
  v = &local_270;
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)a_vector);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x514c5b);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),
             (size_type)in_stack_fffffffffffffae8);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0,
             (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)a_vector);
  amrex::convertToDeviceVector<amrex::BCRec>(v);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator=
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0,
             a_vector);
  amrex::PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~PODVector
            ((PODVector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)in_stack_fffffffffffffae0);
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x514cd7);
  return;
}

Assistant:

NavierStokesBase::NavierStokesBase (Amr&            papa,
                                    int             lev,
                                    const Geometry& level_geom,
                                    const BoxArray& bl,
                                    const DistributionMapping& dm,
                                    Real            time)
    :
    AmrLevel(papa,lev,level_geom,bl,dm,time)
{

    //
    // 2/2022 - Only allow RZ if there's no visc.
    //   MLMG Tensor solver does not currently support RZ
    //
    if ( level_geom.IsRZ() )
    {
#ifdef AMREX_USE_EB
      amrex::Abort("Embedded boundaries with RZ geometry is not currently suppported.");
#endif
        for ( int n = 0; n < AMREX_SPACEDIM; n++ ) {
            if ( visc_coef[n] > 0 ) {
                amrex::Abort("RZ geometry with viscosity is not currently supported. To use set ns.vel_visc_coef=0");
            }
        }
    }

    if(!additional_state_types_initialized) {
        init_additional_state_types();
    }

    const BoxArray& P_grids = state[Press_Type].boxArray();
    //
    // Alloc old_time pressure.
    //
    state[Press_Type].allocOldData();
    state[Gradp_Type].allocOldData();
    //
    // Alloc space for density and temporary pressure variables.
    //
    if (level > 0)
    {
        rho_avg.define(grids,dmap,1,1,MFInfo(),Factory());
        p_avg.define(P_grids,dmap,1,0,MFInfo(),Factory());
    }

    // FIXME -
    // rho_half is passed into level_project to be used as sigma in the MLMG
    // solve, but MLMG doesn't copy any ghost cells, it fills what it needs itself.
    // does rho_half still need any ghost cells?
    //
    // Also, don't really need rho_ptime, only rho_half uses it.
    // rho_ctime is used in PeleLM (there are other options though), and rho_half.
    rho_half.define (grids,dmap,1,1,MFInfo(),Factory());
    rho_ptime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_ctime.define(grids,dmap,1,1,MFInfo(),Factory());
    rho_qtime  = nullptr;
    rho_tqtime = nullptr;
    //
    // Build metric coefficients for RZ calculations.
    // Build volume and areas.
    //
    buildMetrics();


#ifdef AMREX_USE_EB
    init_eb(level_geom, bl, dm);
#endif

    //FIXME --- this fn is really similar to restart()... work on that later

    //
    // Set up reflux registers.
    //
    sync_reg = nullptr;
    if (level > 0 && do_sync_proj)
    {
        sync_reg = new SyncRegister(grids,dmap,crse_ratio);
    }
    advflux_reg  = nullptr;
    viscflux_reg = nullptr;
    if (level > 0 && do_reflux)
    {
        advflux_reg  = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
        viscflux_reg = new FluxRegister(grids,dmap,crse_ratio,level,NUM_STATE);
    }
    //
    // Initialize work multifabs.
    //
    u_mac   = nullptr;
    aofs    = nullptr;

    //
    // Set up the level projector.
    //
    if (projector == nullptr)
    {
        projector = new Projection(parent,&phys_bc,do_sync_proj,
                                   parent->finestLevel(),radius_grow);
    }
    projector->install_level(level,this,&radius);

    //
    // Set up diffusion.
    //
    diffusion = new Diffusion(parent,this,
                              (level > 0) ? getLevel(level-1).diffusion : nullptr,
                              NUM_STATE,viscflux_reg,is_diffusive);
    //
    // Allocate the storage for variable viscosity and diffusivity
    //
    diffn_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    diffnp1_cc = new MultiFab(grids, dmap, NUM_STATE-Density-1, 1, MFInfo(), Factory());
    viscn_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());
    viscnp1_cc = new MultiFab(grids, dmap, 1, 1, MFInfo(), Factory());

    //
    // Set up the mac projector.
    //
    if (mac_projector == nullptr)
    {
        mac_projector = new MacProj(parent,parent->finestLevel(),
                                    &phys_bc,radius_grow);
    }
    mac_projector->install_level(level,this);

    //
    // Initialize BCRec for use with advection
    //
    m_bcrec_velocity.resize(AMREX_SPACEDIM);
    m_bcrec_velocity = fetchBCArray(State_Type,Xvel,AMREX_SPACEDIM);

    m_bcrec_velocity_d.resize(AMREX_SPACEDIM);
    m_bcrec_velocity_d = convertToDeviceVector(m_bcrec_velocity);

    m_bcrec_scalars.resize(NUM_SCALARS);
    m_bcrec_scalars = fetchBCArray(State_Type,Density,NUM_SCALARS);

    m_bcrec_scalars_d.resize(NUM_SCALARS);
    m_bcrec_scalars_d = convertToDeviceVector(m_bcrec_scalars);
}